

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_perl_generator.cc
# Opt level: O3

void __thiscall
t_perl_generator::perl_namespace_dirs
          (t_perl_generator *this,t_program *p,
          list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *dirs)

{
  size_t *psVar1;
  long lVar2;
  _List_node_base *p_Var3;
  _Node *p_Var4;
  string ns;
  _List_node_base *local_90;
  _List_node_base *local_88;
  _List_node_base local_80;
  string local_70;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"perl","");
  t_program::get_namespace(&local_70,p,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (local_70._M_string_length != 0) {
    lVar2 = std::__cxx11::string::find((char *)&local_70,0x3a95db,0);
    if (lVar2 != -1) {
      do {
        std::__cxx11::string::substr((ulong)&local_90,(ulong)&local_70);
        p_Var3 = (_List_node_base *)operator_new(0x30);
        p_Var3[1]._M_next = p_Var3 + 2;
        if (local_90 == &local_80) {
          p_Var3[2]._M_next =
               (_List_node_base *)CONCAT71(local_80._M_next._1_7_,local_80._M_next._0_1_);
          p_Var3[2]._M_prev = local_80._M_prev;
        }
        else {
          p_Var3[1]._M_next = local_90;
          p_Var3[2]._M_next =
               (_List_node_base *)CONCAT71(local_80._M_next._1_7_,local_80._M_next._0_1_);
        }
        p_Var3[1]._M_prev = local_88;
        local_88 = (_List_node_base *)0x0;
        local_80._M_next._0_1_ = 0;
        local_90 = &local_80;
        std::__detail::_List_node_base::_M_hook(p_Var3);
        psVar1 = &(dirs->
                  super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl._M_node._M_size;
        *psVar1 = *psVar1 + 1;
        if (local_90 != &local_80) {
          operator_delete(local_90);
        }
        std::__cxx11::string::substr((ulong)&local_90,(ulong)&local_70);
        std::__cxx11::string::operator=((string *)&local_70,(string *)&local_90);
        if (local_90 != &local_80) {
          operator_delete(local_90);
        }
        lVar2 = std::__cxx11::string::find((char *)&local_70,0x3a95db,0);
      } while (lVar2 != -1);
    }
    if (local_70._M_string_length != 0) {
      p_Var4 = std::__cxx11::list<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
               _M_create_node<std::__cxx11::string_const&>
                         ((list<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)dirs,
                          &local_70);
      std::__detail::_List_node_base::_M_hook(&p_Var4->super__List_node_base);
      psVar1 = &(dirs->
                super__List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                )._M_impl._M_node._M_size;
      *psVar1 = *psVar1 + 1;
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  return;
}

Assistant:

void perl_namespace_dirs(t_program* p, std::list<std::string>& dirs) {
    std::string ns = p->get_namespace("perl");
    std::string::size_type loc;

    if (ns.size() > 0) {
      while ((loc = ns.find(".")) != std::string::npos) {
        dirs.push_back(ns.substr(0, loc));
        ns = ns.substr(loc + 1);
      }
    }

    if (ns.size() > 0) {
      dirs.push_back(ns);
    }
  }